

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase581::run(TestCase581 *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  SegmentBuilder *pSVar3;
  CapTableBuilder *pCVar4;
  int iVar5;
  Builder *params;
  Builder *extraout_RDX;
  Builder *extraout_RDX_00;
  Builder *extraout_RDX_01;
  Builder *params_00;
  char *ptrCopy_1;
  char *ptrCopy;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Reader value;
  Builder root;
  MallocMessageBuilder builder;
  undefined1 local_188 [16];
  WirePointer *local_178;
  StructBuilder local_168;
  Builder local_138;
  MallocMessageBuilder local_108;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_108,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_188,&local_108.super_MessageBuilder);
  local_138._builder.data = local_178;
  local_138._builder.segment = (SegmentBuilder *)local_188._0_8_;
  local_138._builder.capTable = (CapTableBuilder *)local_188._8_8_;
  PointerBuilder::initStruct(&local_168,(PointerBuilder *)&local_138,(StructSize)0x20008);
  *(undefined2 *)&((WireValue<uint32_t>_conflict *)local_168.data)->value = 3;
  *(undefined2 *)&(((WirePointer *)((long)local_168.data + 8))->offsetAndKind).value = 0x7b;
  local_138._builder.data = local_168.pointers + 1;
  *(undefined2 *)((long)&((WireValue<uint32_t>_conflict *)local_168.data)->value + 2) = 0xb;
  local_138._builder.segment = local_168.segment;
  local_138._builder.capTable = local_168.capTable;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_138,value);
  (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_168.data + 4))->structRef).dataSize.
  value = 0;
  *(byte *)&(((WirePointer *)((long)local_168.data + 0x20))->offsetAndKind).value =
       (byte)(((WirePointer *)((long)local_168.data + 0x20))->offsetAndKind).value | 1;
  (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_168.data + 4))->structRef).ptrCount.
  value = 4;
  ((WirePointer *)((long)local_168.data + 0x38))->offsetAndKind = 0xa630f34e;
  ((WirePointer *)((long)local_168.data + 0x38))->field_1 =
       (anon_union_4_5_35ddcec3_for_WirePointer_1)0x1b69b4b;
  kj::str<capnproto_test::capnp::test::TestUnion::Builder&>
            ((String *)&local_138,(kj *)&local_168,params);
  pCVar4 = local_138._builder.capTable;
  pSVar3 = local_138._builder.segment;
  bVar6 = true;
  params_00 = extraout_RDX;
  if (local_138._builder.capTable == (CapTableBuilder *)0xe6) {
    iVar5 = bcmp(local_138._builder.segment,
                 "(union0 = (u0f0s16 = 123), union1 = (u1f0sp = \"foo\"), union2 = (u2f0s1 = true), union3 = (u3f0s64 = 123456789012345678), bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, bit6 = false, bit7 = false, byte0 = 0)"
                 ,0xe5);
    bVar6 = iVar5 != 0;
    params_00 = extraout_RDX_00;
  }
  if (pSVar3 != (SegmentBuilder *)0x0) {
    local_138._builder.segment = (SegmentBuilder *)0x0;
    local_138._builder.capTable = (CapTableBuilder *)0x0;
    (**(code **)*local_138._builder.data)(local_138._builder.data,pSVar3,1,pCVar4,pCVar4,0);
    params_00 = extraout_RDX_01;
  }
  if ((bool)(bVar6 & kj::_::Debug::minSeverity < 3)) {
    kj::str<capnproto_test::capnp::test::TestUnion::Builder&>
              ((String *)&local_138,(kj *)&local_168,params_00);
    kj::_::Debug::log<char_const(&)[290],char_const(&)[230],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x255,ERROR,
               "\"failed: expected \" \"(\\\"(\\\" \\\"union0 = (u0f0s16 = 123), \\\" \\\"union1 = (u1f0sp = \\\\\\\"foo\\\\\\\"), \\\" \\\"union2 = (u2f0s1 = true), \\\" \\\"union3 = (u3f0s64 = 123456789012345678), \\\" \\\"bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, \\\" \\\"bit6 = false, bit7 = false, byte0 = 0)\\\") == (kj::str(root))\", \"(\" \"union0 = (u0f0s16 = 123), \" \"union1 = (u1f0sp = \\\"foo\\\"), \" \"union2 = (u2f0s1 = true), \" \"union3 = (u3f0s64 = 123456789012345678), \" \"bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, \" \"bit6 = false, bit7 = false, byte0 = 0)\", kj::str(root)"
               ,(char (*) [290])
                "failed: expected (\"(\" \"union0 = (u0f0s16 = 123), \" \"union1 = (u1f0sp = \\\"foo\\\"), \" \"union2 = (u2f0s1 = true), \" \"union3 = (u3f0s64 = 123456789012345678), \" \"bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, \" \"bit6 = false, bit7 = false, byte0 = 0)\") == (kj::str(root))"
               ,(char (*) [230])
                "(union0 = (u0f0s16 = 123), union1 = (u1f0sp = \"foo\"), union2 = (u2f0s1 = true), union3 = (u3f0s64 = 123456789012345678), bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, bit6 = false, bit7 = false, byte0 = 0)"
               ,(String *)&local_138);
    pCVar4 = local_138._builder.capTable;
    pSVar3 = local_138._builder.segment;
    if (local_138._builder.segment != (SegmentBuilder *)0x0) {
      local_138._builder.segment = (SegmentBuilder *)0x0;
      local_138._builder.capTable = (CapTableBuilder *)0x0;
      (**(code **)*local_138._builder.data)(local_138._builder.data,pSVar3,1,pCVar4,pCVar4,0);
    }
  }
  local_138._builder.dataSize = local_168.dataSize;
  local_138._builder.pointerCount = local_168.pointerCount;
  local_138._builder._38_2_ = local_168._38_2_;
  local_138._builder.data = local_168.data;
  local_138._builder.pointers = local_168.pointers;
  kj::str<capnproto_test::capnp::test::TestUnion::Union0::Builder>((String *)local_188,&local_138);
  uVar1 = local_188._0_8_;
  uVar2 = local_188._8_8_;
  bVar6 = true;
  if ((CapTableBuilder *)local_188._8_8_ == (CapTableBuilder *)&DAT_00000010) {
    bVar6 = *(long *)((long)&((SegmentReader *)local_188._0_8_)->arena + 7) != 0x29333231203d2036 ||
            ((SegmentReader *)local_188._0_8_)->arena != (Arena *)0x3631733066307528;
  }
  if ((SegmentBuilder *)local_188._0_8_ != (SegmentBuilder *)0x0) {
    local_188 = (undefined1  [16])0x0;
    (**(code **)*local_178)(local_178,uVar1,1,uVar2,uVar2,0);
  }
  if ((bool)(bVar6 & kj::_::Debug::minSeverity < 3)) {
    local_138._builder.dataSize = local_168.dataSize;
    local_138._builder.pointerCount = local_168.pointerCount;
    local_138._builder._38_2_ = local_168._38_2_;
    local_138._builder.data = local_168.data;
    local_138._builder.pointers = local_168.pointers;
    kj::str<capnproto_test::capnp::test::TestUnion::Union0::Builder>((String *)local_188,&local_138)
    ;
    kj::_::Debug::log<char_const(&)[68],char_const(&)[16],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,599,ERROR,
               "\"failed: expected \" \"(\\\"(u0f0s16 = 123)\\\") == (kj::str(root.getUnion0()))\", \"(u0f0s16 = 123)\", kj::str(root.getUnion0())"
               ,(char (*) [68])
                "failed: expected (\"(u0f0s16 = 123)\") == (kj::str(root.getUnion0()))",
               (char (*) [16])"(u0f0s16 = 123)",(String *)local_188);
    uVar1 = local_188._0_8_;
    if ((SegmentBuilder *)local_188._0_8_ != (SegmentBuilder *)0x0) {
      uVar2 = local_188._8_8_;
      local_188 = (undefined1  [16])0x0;
      (**(code **)*local_178)(local_178,uVar1,1,uVar2,uVar2,0);
    }
  }
  local_138._builder.dataSize = local_168.dataSize;
  local_138._builder.pointerCount = local_168.pointerCount;
  local_138._builder._38_2_ = local_168._38_2_;
  local_138._builder.data = local_168.data;
  local_138._builder.pointers = local_168.pointers;
  kj::str<capnproto_test::capnp::test::TestUnion::Union1::Builder>
            ((String *)local_188,(Builder *)&local_138);
  uVar1 = local_188._0_8_;
  uVar2 = local_188._8_8_;
  bVar6 = true;
  if ((CapTableBuilder *)local_188._8_8_ == (CapTableBuilder *)0x11) {
    auVar7[0] = -(*(char *)&((SegmentReader *)local_188._0_8_)->arena == '(');
    auVar7[1] = -(*(char *)((long)&((SegmentReader *)local_188._0_8_)->arena + 1) == 'u');
    auVar7[2] = -(*(char *)((long)&((SegmentReader *)local_188._0_8_)->arena + 2) == '1');
    auVar7[3] = -(*(char *)((long)&((SegmentReader *)local_188._0_8_)->arena + 3) == 'f');
    auVar7[4] = -(*(char *)((long)&((SegmentReader *)local_188._0_8_)->arena + 4) == '0');
    auVar7[5] = -(*(char *)((long)&((SegmentReader *)local_188._0_8_)->arena + 5) == 's');
    auVar7[6] = -(*(char *)((long)&((SegmentReader *)local_188._0_8_)->arena + 6) == 'p');
    auVar7[7] = -(*(char *)((long)&((SegmentReader *)local_188._0_8_)->arena + 7) == ' ');
    auVar7[8] = -((char)(((SegmentReader *)local_188._0_8_)->id).value == '=');
    auVar7[9] = -(*(char *)((long)&(((SegmentReader *)local_188._0_8_)->id).value + 1) == ' ');
    auVar7[10] = -(*(char *)((long)&(((SegmentReader *)local_188._0_8_)->id).value + 2) == '\"');
    auVar7[0xb] = -(*(char *)((long)&(((SegmentReader *)local_188._0_8_)->id).value + 3) == 'f');
    auVar7[0xc] = -(((SegmentReader *)local_188._0_8_)->field_0xc == 'o');
    auVar7[0xd] = -(((SegmentReader *)local_188._0_8_)->field_0xd == 'o');
    auVar7[0xe] = -(((SegmentReader *)local_188._0_8_)->field_0xe == '\"');
    auVar7[0xf] = -(((SegmentReader *)local_188._0_8_)->field_0xf == ')');
    bVar6 = (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar7[0xf] >> 7) << 0xf) != 0xffff;
  }
  if ((SegmentBuilder *)local_188._0_8_ != (SegmentBuilder *)0x0) {
    local_188 = (undefined1  [16])0x0;
    (**(code **)*local_178)(local_178,uVar1,1,uVar2,uVar2,0);
  }
  if ((bool)(bVar6 & kj::_::Debug::minSeverity < 3)) {
    local_138._builder.dataSize = local_168.dataSize;
    local_138._builder.pointerCount = local_168.pointerCount;
    local_138._builder._38_2_ = local_168._38_2_;
    local_138._builder.data = local_168.data;
    local_138._builder.pointers = local_168.pointers;
    kj::str<capnproto_test::capnp::test::TestUnion::Union1::Builder>
              ((String *)local_188,(Builder *)&local_138);
    kj::_::Debug::log<char_const(&)[71],char_const(&)[17],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,600,ERROR,
               "\"failed: expected \" \"(\\\"(u1f0sp = \\\\\\\"foo\\\\\\\")\\\") == (kj::str(root.getUnion1()))\", \"(u1f0sp = \\\"foo\\\")\", kj::str(root.getUnion1())"
               ,(char (*) [71])
                "failed: expected (\"(u1f0sp = \\\"foo\\\")\") == (kj::str(root.getUnion1()))",
               (char (*) [17])"(u1f0sp = \"foo\")",(String *)local_188);
    uVar1 = local_188._0_8_;
    if ((SegmentBuilder *)local_188._0_8_ != (SegmentBuilder *)0x0) {
      uVar2 = local_188._8_8_;
      local_188 = (undefined1  [16])0x0;
      (**(code **)*local_178)(local_178,uVar1,1,uVar2,uVar2,0);
    }
  }
  local_138._builder.dataSize = local_168.dataSize;
  local_138._builder.pointerCount = local_168.pointerCount;
  local_138._builder._38_2_ = local_168._38_2_;
  local_138._builder.data = local_168.data;
  local_138._builder.pointers = local_168.pointers;
  kj::str<capnproto_test::capnp::test::TestUnion::Union2::Builder>
            ((String *)local_188,(Builder *)&local_138);
  uVar1 = local_188._0_8_;
  uVar2 = local_188._8_8_;
  bVar6 = true;
  if ((CapTableBuilder *)local_188._8_8_ == (CapTableBuilder *)&DAT_00000010) {
    bVar6 = *(long *)((long)&((SegmentReader *)local_188._0_8_)->arena + 7) != 0x2965757274203d20 ||
            ((SegmentReader *)local_188._0_8_)->arena != (Arena *)0x2031733066327528;
  }
  if ((SegmentBuilder *)local_188._0_8_ != (SegmentBuilder *)0x0) {
    local_188 = (undefined1  [16])0x0;
    (**(code **)*local_178)(local_178,uVar1,1,uVar2,uVar2,0);
  }
  if ((bool)(bVar6 & kj::_::Debug::minSeverity < 3)) {
    local_138._builder.dataSize = local_168.dataSize;
    local_138._builder.pointerCount = local_168.pointerCount;
    local_138._builder._38_2_ = local_168._38_2_;
    local_138._builder.data = local_168.data;
    local_138._builder.pointers = local_168.pointers;
    kj::str<capnproto_test::capnp::test::TestUnion::Union2::Builder>
              ((String *)local_188,(Builder *)&local_138);
    kj::_::Debug::log<char_const(&)[68],char_const(&)[16],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x259,ERROR,
               "\"failed: expected \" \"(\\\"(u2f0s1 = true)\\\") == (kj::str(root.getUnion2()))\", \"(u2f0s1 = true)\", kj::str(root.getUnion2())"
               ,(char (*) [68])
                "failed: expected (\"(u2f0s1 = true)\") == (kj::str(root.getUnion2()))",
               (char (*) [16])"(u2f0s1 = true)",(String *)local_188);
    uVar1 = local_188._0_8_;
    if ((SegmentBuilder *)local_188._0_8_ != (SegmentBuilder *)0x0) {
      uVar2 = local_188._8_8_;
      local_188 = (undefined1  [16])0x0;
      (**(code **)*local_178)(local_178,uVar1,1,uVar2,uVar2,0);
    }
  }
  local_138._builder.dataSize = local_168.dataSize;
  local_138._builder.pointerCount = local_168.pointerCount;
  local_138._builder._38_2_ = local_168._38_2_;
  local_138._builder.data = local_168.data;
  local_138._builder.pointers = local_168.pointers;
  kj::str<capnproto_test::capnp::test::TestUnion::Union3::Builder>
            ((String *)local_188,(Builder *)&local_138);
  uVar1 = local_188._0_8_;
  uVar2 = local_188._8_8_;
  bVar6 = true;
  if ((CapTableBuilder *)local_188._8_8_ == (CapTableBuilder *)0x1f) {
    auVar9[0] = -(((SegmentReader *)local_188._0_8_)->field_0xe == '4');
    auVar9[1] = -(((SegmentReader *)local_188._0_8_)->field_0xf == '5');
    auVar9[2] = -(*(char *)&(((SegmentReader *)local_188._0_8_)->ptr).ptr == '6');
    auVar9[3] = -(*(char *)((long)&(((SegmentReader *)local_188._0_8_)->ptr).ptr + 1) == '7');
    auVar9[4] = -(*(char *)((long)&(((SegmentReader *)local_188._0_8_)->ptr).ptr + 2) == '8');
    auVar9[5] = -(*(char *)((long)&(((SegmentReader *)local_188._0_8_)->ptr).ptr + 3) == '9');
    auVar9[6] = -(*(char *)((long)&(((SegmentReader *)local_188._0_8_)->ptr).ptr + 4) == '0');
    auVar9[7] = -(*(char *)((long)&(((SegmentReader *)local_188._0_8_)->ptr).ptr + 5) == '1');
    auVar9[8] = -(*(char *)((long)&(((SegmentReader *)local_188._0_8_)->ptr).ptr + 6) == '2');
    auVar9[9] = -(*(char *)((long)&(((SegmentReader *)local_188._0_8_)->ptr).ptr + 7) == '3');
    auVar9[10] = -((char)(((SegmentReader *)local_188._0_8_)->ptr).size_ == '4');
    auVar9[0xb] = -(*(char *)((long)&(((SegmentReader *)local_188._0_8_)->ptr).size_ + 1) == '5');
    auVar9[0xc] = -(*(char *)((long)&(((SegmentReader *)local_188._0_8_)->ptr).size_ + 2) == '6');
    auVar9[0xd] = -(*(char *)((long)&(((SegmentReader *)local_188._0_8_)->ptr).size_ + 3) == '7');
    auVar9[0xe] = -(*(char *)((long)&(((SegmentReader *)local_188._0_8_)->ptr).size_ + 4) == '8');
    auVar9[0xf] = -(*(char *)((long)&(((SegmentReader *)local_188._0_8_)->ptr).size_ + 5) == ')');
    auVar8[0] = -(*(char *)&((SegmentReader *)local_188._0_8_)->arena == '(');
    auVar8[1] = -(*(char *)((long)&((SegmentReader *)local_188._0_8_)->arena + 1) == 'u');
    auVar8[2] = -(*(char *)((long)&((SegmentReader *)local_188._0_8_)->arena + 2) == '3');
    auVar8[3] = -(*(char *)((long)&((SegmentReader *)local_188._0_8_)->arena + 3) == 'f');
    auVar8[4] = -(*(char *)((long)&((SegmentReader *)local_188._0_8_)->arena + 4) == '0');
    auVar8[5] = -(*(char *)((long)&((SegmentReader *)local_188._0_8_)->arena + 5) == 's');
    auVar8[6] = -(*(char *)((long)&((SegmentReader *)local_188._0_8_)->arena + 6) == '6');
    auVar8[7] = -(*(char *)((long)&((SegmentReader *)local_188._0_8_)->arena + 7) == '4');
    auVar8[8] = -((char)(((SegmentReader *)local_188._0_8_)->id).value == ' ');
    auVar8[9] = -(*(char *)((long)&(((SegmentReader *)local_188._0_8_)->id).value + 1) == '=');
    auVar8[10] = -(*(char *)((long)&(((SegmentReader *)local_188._0_8_)->id).value + 2) == ' ');
    auVar8[0xb] = -(*(char *)((long)&(((SegmentReader *)local_188._0_8_)->id).value + 3) == '1');
    auVar8[0xc] = -(((SegmentReader *)local_188._0_8_)->field_0xc == '2');
    auVar8[0xd] = -(((SegmentReader *)local_188._0_8_)->field_0xd == '3');
    auVar8[0xe] = -(((SegmentReader *)local_188._0_8_)->field_0xe == '4');
    auVar8[0xf] = -(((SegmentReader *)local_188._0_8_)->field_0xf == '5');
    auVar8 = auVar8 & auVar9;
    bVar6 = (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) != 0xffff;
  }
  if ((SegmentBuilder *)local_188._0_8_ != (SegmentBuilder *)0x0) {
    local_188 = (undefined1  [16])0x0;
    (**(code **)*local_178)(local_178,uVar1,1,uVar2,uVar2,0);
  }
  if ((bool)(bVar6 & kj::_::Debug::minSeverity < 3)) {
    local_138._builder.dataSize = local_168.dataSize;
    local_138._builder.pointerCount = local_168.pointerCount;
    local_138._builder._38_2_ = local_168._38_2_;
    local_138._builder.data = local_168.data;
    local_138._builder.pointers = local_168.pointers;
    kj::str<capnproto_test::capnp::test::TestUnion::Union3::Builder>
              ((String *)local_188,(Builder *)&local_138);
    kj::_::Debug::log<char_const(&)[83],char_const(&)[31],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x25a,ERROR,
               "\"failed: expected \" \"(\\\"(u3f0s64 = 123456789012345678)\\\") == (kj::str(root.getUnion3()))\", \"(u3f0s64 = 123456789012345678)\", kj::str(root.getUnion3())"
               ,(char (*) [83])
                "failed: expected (\"(u3f0s64 = 123456789012345678)\") == (kj::str(root.getUnion3()))"
               ,(char (*) [31])"(u3f0s64 = 123456789012345678)",(String *)local_188);
    uVar1 = local_188._0_8_;
    if ((SegmentBuilder *)local_188._0_8_ != (SegmentBuilder *)0x0) {
      uVar2 = local_188._8_8_;
      local_188 = (undefined1  [16])0x0;
      (**(code **)*local_178)(local_178,uVar1,1,uVar2,uVar2,0);
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_108);
  return;
}

Assistant:

TEST(Stringify, Unions) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestUnion>();

  root.getUnion0().setU0f0s16(123);
  root.getUnion1().setU1f0sp("foo");
  root.getUnion2().setU2f0s1(true);
  root.getUnion3().setU3f0s64(123456789012345678ll);

  EXPECT_EQ("("
      "union0 = (u0f0s16 = 123), "
      "union1 = (u1f0sp = \"foo\"), "
      "union2 = (u2f0s1 = true), "
      "union3 = (u3f0s64 = 123456789012345678), "
      "bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, "
      "bit6 = false, bit7 = false, byte0 = 0)",
      kj::str(root));

  EXPECT_EQ("(u0f0s16 = 123)", kj::str(root.getUnion0()));
  EXPECT_EQ("(u1f0sp = \"foo\")", kj::str(root.getUnion1()));
  EXPECT_EQ("(u2f0s1 = true)", kj::str(root.getUnion2()));
  EXPECT_EQ("(u3f0s64 = 123456789012345678)", kj::str(root.getUnion3()));
}